

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  int iVar1;
  uint *puVar2;
  Instruction *pc;
  int reg_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    luaK_codeABC(fs,OP_LOADBOOL,reg,(uint)(e->k == VTRUE),0);
    break;
  case VK:
    luaK_codek(fs,reg,(e->u).info);
    break;
  case VKFLT:
    iVar1 = luaK_numberK(fs,(e->u).nval);
    luaK_codek(fs,reg,iVar1);
    break;
  case VKINT:
    iVar1 = luaK_intK(fs,(e->u).ival);
    luaK_codek(fs,reg,iVar1);
    break;
  case VNONRELOC:
    if (reg != (e->u).info) {
      luaK_codeABC(fs,OP_MOVE,reg,(e->u).info,0);
    }
    break;
  default:
    return;
  case VRELOCABLE:
    puVar2 = fs->f->code + (e->u).info;
    *puVar2 = *puVar2 & 0xffffc03f | (reg & 0xffU) << 6;
  }
  (e->u).info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void discharge2reg(FuncState *fs, expdesc *e, int reg) {
    luaK_dischargevars(fs, e);
    switch (e->k) {
        case VNIL: {
            luaK_nil(fs, reg, 1);
            break;
        }
        case VFALSE:
        case VTRUE: {
            luaK_codeABC(fs, OP_LOADBOOL, reg, e->k == VTRUE, 0);
            break;
        }
        case VK: {
            luaK_codek(fs, reg, e->u.info);
            break;
        }
        case VKFLT: {
            luaK_codek(fs, reg, luaK_numberK(fs, e->u.nval));
            break;
        }
        case VKINT: {
            luaK_codek(fs, reg, luaK_intK(fs, e->u.ival));
            break;
        }
        case VRELOCABLE: {
            Instruction *pc = &getinstruction(fs, e);
            SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
            break;
        }
        case VNONRELOC: {
            if (reg != e->u.info)
                luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
            break;
        }
        default: {
            lua_assert(e->k == VJMP);
            return;  /* nothing to do... */
        }
    }
    e->u.info = reg;
    e->k = VNONRELOC;
}